

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O1

YearMonthDay muduo::detail::getYearMonthDay(int julianDayNumber)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  YearMonthDay YVar7;
  
  iVar1 = (julianDayNumber * 4 + 0x1f4b3) / 0x23ab1;
  iVar2 = iVar1 * 0x23ab1;
  iVar3 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  iVar6 = (julianDayNumber + 0x7d2c) - (iVar3 >> 2);
  iVar3 = (iVar6 * 4 + 3) / 0x5b5;
  iVar4 = iVar3 * 0x5b5;
  iVar2 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar6 = iVar6 - (iVar2 >> 2);
  iVar2 = iVar6 * 5 + 2;
  iVar4 = (int)((ulong)((long)iVar2 * -0x29d47f29) >> 0x20) + iVar6 * 5 + 2;
  iVar5 = (iVar4 >> 7) - (iVar4 >> 0x1f);
  iVar4 = (int)((ulong)((long)(iVar5 * 0x99 + 2) * -0x66666667) >> 0x20);
  YVar7.day = ((iVar4 >> 1) - (iVar4 >> 0x1f)) + iVar6 + 1;
  iVar2 = iVar2 / 0x5fa;
  YVar7.year = iVar1 * 100 + iVar3 + iVar2 + -0x12c0;
  YVar7.month = iVar5 + iVar2 * -0xc + 3;
  return YVar7;
}

Assistant:

struct Date::YearMonthDay getYearMonthDay(int julianDayNumber)
{
  int a = julianDayNumber + 32044;
  int b = (4 * a + 3) / 146097;
  int c = a - ((b * 146097) / 4);
  int d = (4 * c + 3) / 1461;
  int e = c - ((1461 * d) / 4);
  int m = (5 * e + 2) / 153;
  Date::YearMonthDay ymd;
  ymd.day = e - ((153 * m + 2) / 5) + 1;
  ymd.month = m + 3 - 12 * (m / 10);
  ymd.year = b * 100 + d - 4800 + (m / 10);
  return ymd;
}